

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>
                 *this,Index target,Index eventIndex)

{
  uint uVar1;
  Index source;
  pointer pIVar2;
  pointer puVar3;
  pointer puVar4;
  undefined1 *puVar5;
  ulong uVar6;
  Column_support *pCVar7;
  long lVar8;
  ulong uVar9;
  
  if ((this->reducedMatrixR_).
      super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>_>
      .rowSwapped_ == true) {
    if ((this->reducedMatrixR_).nextInsertIndex_ != 0) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        pIVar2 = (this->reducedMatrixR_).matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(this->reducedMatrixR_).matrix_.
                       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 3) *
                0x6db6db6db6db6db7;
        if (uVar6 < uVar9 || uVar6 - uVar9 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar9);
        }
        Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,false,false>>>
        ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,true,false,false,true,false,false>>>
                    *)((long)&(pIVar2->super_Row_access_option).columnIndex_ + lVar8),
                   &(this->reducedMatrixR_).
                    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>_>
                    .rowToIndex_,(Index)uVar9);
        uVar9 = uVar9 + 1;
        uVar1 = (this->reducedMatrixR_).nextInsertIndex_;
        lVar8 = lVar8 + 0x38;
      } while (uVar9 < uVar1);
      if (uVar1 != 0) {
        puVar3 = (this->reducedMatrixR_).
                 super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>_>
                 .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (this->reducedMatrixR_).
                 super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>_>
                 .rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          puVar3[uVar9] = (uint)uVar9;
          puVar4[uVar9] = (uint)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar9 < (this->reducedMatrixR_).nextInsertIndex_);
      }
    }
    (this->reducedMatrixR_).
    super_template_Base_swap_option<Boundary_matrix<Matrix<RU_vine_options_with_row_access<(Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>_>
    .rowSwapped_ = false;
  }
  pIVar2 = (this->reducedMatrixR_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar7 = &pIVar2[target].column_;
  puVar5 = *(undefined1 **)&(pCVar7->super_type).data_.root_plus_size_;
  if (((Column_support *)puVar5 != pCVar7 && puVar5 != (undefined1 *)0x0) &&
     (uVar9 = (ulong)*(uint *)&(*(node_ptr *)((long)&pIVar2[target].column_.super_type.data_ + 8))
                               [1].next_, uVar9 != 0xffffffff)) {
    source = (this->pivotToColumnIndex_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
    while (source != 0xffffffff) {
      _reduce_column_by(this,target,source);
      puVar5 = *(undefined1 **)&(pCVar7->super_type).data_.root_plus_size_;
      if (puVar5 == (undefined1 *)0x0) {
        return;
      }
      if ((Column_support *)puVar5 == pCVar7) {
        return;
      }
      uVar9 = (ulong)*(uint *)&(*(node_ptr *)((long)&pIVar2[target].column_.super_type.data_ + 8))
                               [1].next_;
      if (uVar9 == 0xffffffff) {
        return;
      }
      source = (this->pivotToColumnIndex_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
    }
    (this->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar9] = target;
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}